

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  Precision PVar1;
  size_t sVar2;
  ulong uVar3;
  Capability *pCVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  SPIREntryPoint *pSVar8;
  const_iterator cVar9;
  uint64_t uVar10;
  CompilerError *this_01;
  uint *z;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  SpecializationConstant SVar12;
  char *ts;
  ShaderSubgroupSupportHelper *pSVar13;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_02;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  char *extra_predicate;
  char *name;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  extra_names;
  SpecializationConstant local_13b0;
  SpecializationConstant local_13a8;
  undefined1 local_1398 [32];
  ShaderSubgroupSupportHelper *local_1378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1370;
  char *local_1368;
  char *local_1360;
  undefined1 local_1358 [280];
  undefined1 local_1240 [280];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar8 = Compiler::get_entry_point(&this->super_Compiler);
  local_1128._0_8_ = " es";
  if ((this->options).version < 0x65) {
    local_1128._0_8_ = (long)"\x05\x05\x04" + 3;
  }
  if ((this->options).es == false) {
    local_1128._0_8_ = (long)"\x05\x05\x04" + 3;
  }
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,(char **)local_1128);
  if (((this->options).es == false) && ((this->options).version < 0x1a4)) {
    if ((this->options).enable_420pack_extension == true) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if (((pSVar8->flags).lower & 0x200) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_shader_image_load_store","");
      require_extension_internal(this,(string *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
  }
  local_1128._0_4_ = 0x115e;
  this_00 = &(pSVar8->flags).higher;
  cVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
  if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    local_1128._0_8_ = (long)local_1128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1128,"GL_ARB_post_depth_coverage","");
    require_extension_internal(this,(string *)local_1128);
    if (local_1128._0_8_ != (long)local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  local_1128._0_4_ = 0x14f6;
  cVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
  local_1398._24_8_ = pSVar8;
  if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_1128._0_4_ = 0x14f7;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_00310100;
    local_1128._0_4_ = 0x14f8;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_00310100;
    local_1128._0_4_ = 0x14f9;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_00310100;
    bVar5 = false;
  }
  else {
LAB_00310100:
    uVar7 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar7 < 0x136) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"At least ESSL 3.10 required for fragment shader interlock.");
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_NV_fragment_shader_interlock","");
      require_extension_internal(this,(string *)local_1128);
    }
    else {
      if (uVar7 < 0x1a4) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_shader_image_load_store","");
        require_extension_internal(this,(string *)local_1128);
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_fragment_shader_interlock","");
      require_extension_internal(this,(string *)local_1128);
    }
    if (local_1128._0_8_ != (long)local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    bVar5 = true;
  }
  sVar2 = (this->forced_extensions).
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar2 != 0) {
    pbVar16 = (this->forced_extensions).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    lVar14 = sVar2 << 5;
    do {
      iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
      if (iVar6 == 0) {
        statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_ARB_gpu_shader_int64)");
        statement<char_const(&)[45]>
                  (this,(char (*) [45])"#extension GL_ARB_gpu_shader_int64 : require");
        if (((this->options).vulkan_semantics != true) || ((this->options).es == true)) {
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
        }
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[51]>
                  (this,(char (*) [51])"#error No extension available for 64-bit integers.");
        goto LAB_00310491;
      }
      iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
      if (iVar6 == 0) {
        statement<char_const(&)[42]>
                  (this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
        statement<char_const(&)[50]>
                  (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
        if ((this->options).vulkan_semantics == false) {
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
        }
        else {
          statement<char_const(&)[63]>
                    (this,(char (*) [63])
                          "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
          statement<char_const(&)[69]>
                    (this,(char (*) [69])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
        }
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        ts = "#error No extension available for FP16.";
LAB_0031048c:
        statement<char_const(&)[40]>(this,(char (*) [40])ts);
LAB_00310491:
        statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
      }
      else {
        iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          if ((this->options).vulkan_semantics == true) {
            statement<char_const(&)[66]>
                      (this,(char (*) [66])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
            goto LAB_0031049c;
          }
          statement<char_const(&)[58]>
                    (this,(char (*) [58])"#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)"
                    );
          statement<char_const(&)[66]>
                    (this,(char (*) [66])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          ts = "#error No extension available for Int8.";
          goto LAB_0031048c;
        }
        iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          if ((this->options).vulkan_semantics == true) {
            statement<char_const(&)[67]>
                      (this,(char (*) [67])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
            goto LAB_0031049c;
          }
          statement<char_const(&)[59]>
                    (this,(char (*) [59])
                          "#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
          statement<char_const(&)[67]>
                    (this,(char (*) [67])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
          statement<char_const(&)[39]>(this,(char (*) [39])"#elif defined(GL_AMD_gpu_shader_int16)")
          ;
          statement<char_const(&)[45]>
                    (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[41]>
                    (this,(char (*) [41])"#error No extension available for Int16.");
          goto LAB_00310491;
        }
        iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          if ((this->options).es == true) {
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
            goto LAB_0031049c;
          }
          statement<char_const(&)[39]>(this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)")
          ;
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
          goto LAB_00310491;
        }
        if (((this->options).vulkan_semantics == false) &&
           (iVar6 = ::std::__cxx11::string::compare((char *)pbVar16), iVar6 == 0)) {
          statement<char_const(&)[8],std::__cxx11::string&>(this,(char (*) [8])"#ifdef ",pbVar16);
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                    (this,(char (*) [12])"#extension ",pbVar16,(char (*) [10])0x3fe886);
          goto LAB_00310491;
        }
        iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          statement<char_const(&)[44]>
                    (this,(char (*) [44])"#if defined(GL_EXT_control_flow_attributes)");
          statement<char_const(&)[52]>
                    (this,(char (*) [52])"#extension GL_EXT_control_flow_attributes : require");
          statement<char_const(&)[40]>
                    (this,(char (*) [40])"#define SPIRV_CROSS_FLATTEN [[flatten]]");
          statement<char_const(&)[44]>
                    (this,(char (*) [44])"#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
          statement<char_const(&)[38]>(this,(char (*) [38])"#define SPIRV_CROSS_UNROLL [[unroll]]");
          statement<char_const(&)[41]>
                    (this,(char (*) [41])"#define SPIRV_CROSS_LOOP [[dont_unroll]]");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[28]>(this,(char (*) [28])"#define SPIRV_CROSS_FLATTEN");
          statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_BRANCH");
          statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_UNROLL");
          statement<char_const(&)[25]>(this,(char (*) [25])"#define SPIRV_CROSS_LOOP");
          goto LAB_00310491;
        }
        iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          statement<char_const(&)[53]>
                    (this,(char (*) [53])"#extension GL_NV_fragment_shader_interlock : require");
          statement<char_const(&)[76]>
                    (this,(char (*) [76])
                          "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()"
                    );
          statement<char_const(&)[72]>
                    (this,(char (*) [72])
                          "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()")
          ;
        }
        else {
          iVar6 = ::std::__cxx11::string::compare((char *)pbVar16);
          if (iVar6 == 0) {
            statement<char_const(&)[40]>
                      (this,(char (*) [40])"#ifdef GL_ARB_fragment_shader_interlock");
            statement<char_const(&)[53]>
                      (this,(char (*) [53])"#extension GL_ARB_fragment_shader_interlock : enable");
            statement<char_const(&)[77]>
                      (this,(char (*) [77])
                            "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()"
                      );
            statement<char_const(&)[73]>
                      (this,(char (*) [73])
                            "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()"
                      );
            statement<char_const(&)[49]>
                      (this,(char (*) [49])"#elif defined(GL_INTEL_fragment_shader_ordering)");
            statement<char_const(&)[54]>
                      (this,(char (*) [54])"#extension GL_INTEL_fragment_shader_ordering : enable");
            statement<char_const(&)[82]>
                      (this,(char (*) [82])
                            "#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()"
                      );
            statement<char_const(&)[45]>
                      (this,(char (*) [45])"#define SPIRV_Cross_endInvocationInterlock()");
            goto LAB_00310491;
          }
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                    (this,(char (*) [12])"#extension ",pbVar16,(char (*) [11])0x3fe087);
        }
      }
LAB_0031049c:
      pbVar16 = pbVar16 + 1;
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != 0);
  }
  if ((this->options).vulkan_semantics == false) {
    pSVar13 = &this->shader_subgroup_supporter;
    ShaderSubgroupSupportHelper::resolve((Result *)local_1240,pSVar13);
    lVar14 = 0;
    local_1378 = pSVar13;
    do {
      if ((pSVar13->feature_mask >> ((Feature)lVar14 & (FeatureCount|SubgroupID)) & 1) != 0) {
        local_1398._16_8_ = lVar14;
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)local_1358,(Feature)lVar14,(Result *)local_1240);
        if (local_1358._8_8_ != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x3dee59);
          if (local_1358._8_8_ != 0) {
            local_1370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_1358._0_8_)->_M_p + local_1358._8_8_ * 4);
            uVar11 = extraout_RDX;
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1358._0_8_;
            do {
              pSVar13 = (ShaderSubgroupSupportHelper *)(ulong)*(uint *)&(pbVar16->_M_dataplus)._M_p;
              local_13b0 = (SpecializationConstant)((long)"\x05\x05\x04" + 3);
              if (pSVar13 == (ShaderSubgroupSupportHelper *)0x9) {
                local_13b0 = (SpecializationConstant)0x407455;
              }
              local_13a8 = *(SpecializationConstant *)
                            (ShaderSubgroupSupportHelper::get_extension_name::retval + (long)pSVar13
                            );
              if (pSVar13 == (ShaderSubgroupSupportHelper *)0x7) {
                local_13b0 = (SpecializationConstant)0x407438;
              }
              ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                        ((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)local_1128,pSVar13,(Candidate)uVar11);
              local_1360 = "#elif";
              if (pbVar16 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1358._0_8_) {
                local_1360 = "#if";
              }
              local_1368 = " && ";
              if (*(char *)local_13b0 == '\0') {
                local_1368 = "";
              }
              statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                        (this,&local_1360,(char (*) [10])" defined(",(char **)&local_13a8,
                         (char (*) [2])0x406dab,&local_1368,(char **)&local_13b0);
              if (local_1128._8_8_ != 0) {
                lVar14 = local_1128._8_8_ << 5;
                SVar12 = (SpecializationConstant)local_1128._0_8_;
                do {
                  statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                            (this,(char (*) [12])"#extension ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             SVar12,(char (*) [10])0x3fe886);
                  SVar12 = (SpecializationConstant)((long)SVar12 + 0x20);
                  lVar14 = lVar14 + -0x20;
                } while (lVar14 != 0);
              }
              statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                        (this,(char (*) [12])"#extension ",(char **)&local_13a8,
                         (char (*) [11])0x3fe087);
              SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
              ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                              *)local_1128);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar16->_M_dataplus)._M_p + 4);
              uVar11 = extraout_RDX_00;
            } while (pbVar16 != local_1370);
          }
          pSVar13 = local_1378;
          if (ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions::retval
              [local_1398._16_8_] == false) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        local_1358._8_8_ = 0;
        lVar14 = local_1398._16_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1358._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1358 + 0x18)
           ) {
          free((void *)local_1358._0_8_);
          lVar14 = local_1398._16_8_;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1c);
  }
  uVar11 = local_1398._24_8_;
  sVar2 = (this->header_lines).
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar2 != 0) {
    pbVar16 = (this->header_lines).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    lVar14 = sVar2 << 5;
    do {
      statement<std::__cxx11::string&>(this,pbVar16);
      pbVar16 = pbVar16 + 1;
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != 0);
  }
  local_1358._0_8_ = local_1358 + 0x18;
  local_1358._8_8_ = 0;
  local_1358._16_8_ = 8;
  local_1240._0_8_ = local_1240 + 0x18;
  local_1240._8_8_ = 0;
  local_1240._16_8_ = 8;
  z = &switchD_003109d5::switchdataD_003fbe70;
  switch(*(ExecutionModel *)(uVar11 + 0xe8)) {
  case ExecutionModelVertex:
    if ((this->options).ovr_multiview_view_count == 0) goto LAB_003116d1;
    join<char_const(&)[13],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"num_views = ",
               (char (*) [13])&(this->options).ovr_multiview_view_count,
               &switchD_003109d5::switchdataD_003fbe70);
    this_02 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1358;
    break;
  case ExecutionModelTessellationControl:
    if ((((Bitset *)(uVar11 + 0x80))->lower & 0x4000000) == 0) goto LAB_003116d1;
    join<char_const(&)[12],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)0x3fe9b7,(char (*) [12])(uVar11 + 0xe0),
               &switchD_003109d5::switchdataD_003fbe70);
    this_02 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1240;
    break;
  case ExecutionModelTessellationEvaluation:
    uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    if (((uint)uVar10 >> 0x18 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"quads","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if (((uint)uVar10 >> 0x16 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if (((uint)uVar10 >> 0x19 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"isolines","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if (((uint)uVar10 >> 10 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"point_mode","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if (((uint)uVar10 >> 0x19 & 1) == 0) {
      if ((uVar10 & 0x10) != 0) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"cw","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1358,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
      }
      if ((uVar10 & 0x20) != 0) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"ccw","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1358,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
      }
    }
    if ((uVar10 & 4) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"fractional_even_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar10 & 8) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"fractional_odd_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar10 & 2) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"equal_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    goto LAB_003116d1;
  case ExecutionModelGeometry:
    uVar3 = ((Bitset *)(uVar11 + 0x80))->lower;
    uVar7 = (uint)uVar3;
    if (((uVar3 & 1) != 0) && (*(uint32_t *)(uVar11 + 0xdc) != 1)) {
      join<char_const(&)[15],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"invocations = ",(char (*) [15])(uVar11 + 0xdc)
                 ,&switchD_003109d5::switchdataD_003fbe70);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x13 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x14 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x15 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines_adjacency","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x16 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x17 & 1) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"triangles_adjacency","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if (*(bool *)(uVar11 + 0xec) != false) goto LAB_003116d1;
    join<char_const(&)[16],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_vertices = ",(char (*) [16])(uVar11 + 0xe0),
               z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    SVar12 = (SpecializationConstant)((long)local_1128 + 0x10);
    if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
      operator_delete((void *)local_1128._0_8_);
    }
    uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    if ((uVar7 >> 0x1d & 1) != 0) {
      local_1128._0_8_ = SVar12;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangle_strip","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x1b & 1) != 0) {
      local_1128._0_8_ = SVar12;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar7 = (uint)((Bitset *)(uVar11 + 0x80))->lower;
    }
    if ((uVar7 >> 0x1c & 1) == 0) goto LAB_003116d1;
    local_1128._0_8_ = SVar12;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"line_strip","");
    goto LAB_00311427;
  case ExecutionModelFragment:
    if ((this->options).es == true) {
      PVar1 = (this->options).fragment.default_float_precision;
      if (PVar1 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      else if (PVar1 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar1 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      PVar1 = (this->options).fragment.default_int_precision;
      if (PVar1 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
      else if (PVar1 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar1 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
    }
    if ((((Bitset *)(uVar11 + 0x80))->lower & 0x200) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"early_fragment_tests","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    local_1128._0_4_ = 0x115e;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"post_depth_coverage","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if (bVar5) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"#if defined(GL_ARB_fragment_shader_interlock)");
    }
    local_1128._0_4_ = 0x14f6;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      local_1128._0_4_ = 0x14f7;
      cVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
      if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        local_1128._0_4_ = 0x14f8;
        cVar9 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
        if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          local_1128._0_4_ = 0x14f9;
          cVar9 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
          if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"layout(sample_interlock_unordered) in;");
          }
        }
        else {
          statement<char_const(&)[37]>(this,(char (*) [37])"layout(sample_interlock_ordered) in;");
        }
      }
      else {
        statement<char_const(&)[38]>(this,(char (*) [38])"layout(pixel_interlock_unordered) in;");
      }
    }
    else {
      statement<char_const(&)[36]>(this,(char (*) [36])"layout(pixel_interlock_ordered) in;");
    }
    if (bVar5) {
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#elif !defined(GL_INTEL_fragment_shader_ordering)");
      statement<char_const(&)[61]>
                (this,(char (*) [61])"#error Fragment Shader Interlock/Ordering extension missing!")
      ;
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if ((this->options).es == false) {
      uVar10 = ((Bitset *)(uVar11 + 0x80))->lower;
      if (((uint)uVar10 >> 0xe & 1) == 0) {
        if ((short)uVar10 < 0) {
          statement<char_const(&)[43]>
                    (this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;");
        }
      }
      else {
        statement<char_const(&)[46]>
                  (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
      }
    }
    goto LAB_003116d1;
  case ExecutionModelGLCompute:
    goto switchD_003109d5_caseD_5;
  default:
    z = (uint *)(SpecializationConstant *)0x0;
    if (1 < *(ExecutionModel *)(uVar11 + 0xe8) - ExecutionModelTaskEXT) goto LAB_003116d1;
switchD_003109d5_caseD_5:
    if ((((WorkgroupSize *)(uVar11 + 0xc0))->constant == 0) &&
       ((((Bitset *)(uVar11 + 0x80))->lower & 0x4000000000) == 0)) {
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_x = ",
                 (char (*) [16])(uVar11 + 0xc0),z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      SVar12 = (SpecializationConstant)((long)local_1128 + 0x10);
      if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
        operator_delete((void *)local_1128._0_8_);
      }
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&((WorkgroupSize *)(uVar11 + 0xc0))->y,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
        operator_delete((void *)local_1128._0_8_);
      }
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&((WorkgroupSize *)(uVar11 + 0xc0))->z,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1358,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    else {
      local_1128._0_8_ = local_1128._0_8_ & 0xffffffff00000000;
      local_13a8 = (SpecializationConstant)((ulong)local_13a8 & 0xffffffff00000000);
      z = (uint *)&local_13b0;
      local_13b0 = (SpecializationConstant)((ulong)local_13b0 & 0xffffffff00000000);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,(SpecializationConstant *)local_1128,&local_13a8,
                 (SpecializationConstant *)z);
      if (((this->options).vulkan_semantics != false) ||
         (((local_1128._0_4_ == 0 && (local_13a8.id.id == 0)) && (local_13b0.id.id == 0)))) {
        z = (uint *)&local_13a8;
        build_workgroup_size
                  (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_1358,(SpecializationConstant *)local_1128,
                   (SpecializationConstant *)z,&local_13b0);
      }
    }
    if (*(ExecutionModel *)(uVar11 + 0xe8) != ExecutionModelMeshEXT) goto LAB_003116d1;
    join<char_const(&)[16],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_vertices = ",(char (*) [16])(uVar11 + 0xe0),
               z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    SVar12 = (SpecializationConstant)((long)local_1128 + 0x10);
    if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
      operator_delete((void *)local_1128._0_8_);
    }
    join<char_const(&)[18],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_primitives = ",
               (char (*) [18])(uVar11 + 0xe4),z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((SpecializationConstant)local_1128._0_8_ != SVar12) {
      operator_delete((void *)local_1128._0_8_);
    }
    local_1128._0_4_ = 0x14b2;
    cVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      local_1128._0_4_ = 0x1495;
      cVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,(key_type_conflict *)local_1128);
      if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        if ((((Bitset *)(uVar11 + 0x80))->lower & 0x8000000) == 0) goto LAB_003116d1;
        local_1128._0_8_ = SVar12;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      }
      else {
        local_1128._0_8_ = SVar12;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines","");
      }
    }
    else {
      local_1128._0_8_ = SVar12;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
    }
LAB_00311427:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if (local_1128._0_8_ == (long)local_1128 + 0x10) goto LAB_003116d1;
    goto LAB_0031144b;
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128);
  if (local_1128._0_8_ != (long)local_1128 + 0x10) {
LAB_0031144b:
    operator_delete((void *)local_1128._0_8_);
  }
LAB_003116d1:
  sVar2 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  if (sVar2 != 0) {
    pCVar4 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
    lVar14 = 0;
    do {
      if (*(int *)((long)pCVar4 + lVar14) == 0x117e) {
        statement<char_const(&)[27]>(this,(char (*) [27])"layout(primitive_culling);");
      }
      lVar14 = lVar14 + 4;
    } while (sVar2 << 2 != lVar14);
  }
  if (local_1358._8_8_ != 0) {
    local_110 = local_f8;
    local_1128._16_8_ = 0;
    local_1128._0_4_ = 0;
    local_1128._4_4_ = 0;
    local_1128._8_8_ = 0;
    local_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1358._8_8_ != 0) {
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1358._0_8_ + local_1358._8_8_ * 0x20);
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1358._0_8_;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar16->_M_dataplus)._M_p,
                   pbVar16->_M_string_length);
        if (pbVar16 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_1358._0_8_ + (local_1358._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar15);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_13a8,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_13a8,
               (char (*) [6])0x3feb7c);
    if (local_13a8 != (SpecializationConstant)local_1398) {
      operator_delete((void *)local_13a8);
    }
  }
  if (local_1240._8_8_ != 0) {
    local_110 = local_f8;
    local_1128._16_8_ = 0;
    local_1128._0_4_ = 0;
    local_1128._4_4_ = 0;
    local_1128._8_8_ = 0;
    local_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1240._8_8_ != 0) {
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1240._0_8_ + local_1240._8_8_ * 0x20);
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1240._0_8_;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar16->_M_dataplus)._M_p,
                   pbVar16->_M_string_length);
        if (pbVar16 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_1240._0_8_ + (local_1240._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar15);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_13a8,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_13a8,
               (char (*) [7])") out;");
    if (local_13a8 != (SpecializationConstant)local_1398) {
      operator_delete((void *)local_13a8);
    }
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x3dee59);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1240);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1358);
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	bool interlock_used = execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT);

	if (interlock_used)
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_ARB_gpu_shader_int64")
		{
			statement("#if defined(GL_ARB_gpu_shader_int64)");
			statement("#extension GL_ARB_gpu_shader_int64 : require");
			if (!options.vulkan_semantics || options.es)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			statement("#else");
			statement("#error No extension available for 64-bit integers.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int8")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int8.");
				statement("#endif");
			}
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
				statement("#elif defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else if (ext == "GL_EXT_control_flow_attributes")
		{
			// These are just hints so we can conditionally enable and fallback in the shader.
			statement("#if defined(GL_EXT_control_flow_attributes)");
			statement("#extension GL_EXT_control_flow_attributes : require");
			statement("#define SPIRV_CROSS_FLATTEN [[flatten]]");
			statement("#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
			statement("#define SPIRV_CROSS_UNROLL [[unroll]]");
			statement("#define SPIRV_CROSS_LOOP [[dont_unroll]]");
			statement("#else");
			statement("#define SPIRV_CROSS_FLATTEN");
			statement("#define SPIRV_CROSS_BRANCH");
			statement("#define SPIRV_CROSS_UNROLL");
			statement("#define SPIRV_CROSS_LOOP");
			statement("#endif");
		}
		else if (ext == "GL_NV_fragment_shader_interlock")
		{
			statement("#extension GL_NV_fragment_shader_interlock : require");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()");
		}
		else if (ext == "GL_ARB_fragment_shader_interlock")
		{
			statement("#ifdef GL_ARB_fragment_shader_interlock");
			statement("#extension GL_ARB_fragment_shader_interlock : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()");
			statement("#elif defined(GL_INTEL_fragment_shader_ordering)");
			statement("#extension GL_INTEL_fragment_shader_ordering : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()");
			statement("#define SPIRV_Cross_endInvocationInterlock()");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (options.ovr_multiview_view_count)
			inputs.push_back(join("num_views = ", options.ovr_multiview_view_count));
		break;
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	{
		if (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId))
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}

		if (execution.model == ExecutionModelMeshEXT)
		{
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			outputs.push_back(join("max_primitives = ", execution.output_primitives));
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				outputs.push_back("triangles");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				outputs.push_back("lines");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (interlock_used)
			statement("#if defined(GL_ARB_fragment_shader_interlock)");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			statement("layout(pixel_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			statement("layout(pixel_interlock_unordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			statement("layout(sample_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			statement("layout(sample_interlock_unordered) in;");

		if (interlock_used)
		{
			statement("#elif !defined(GL_INTEL_fragment_shader_ordering)");
			statement("#error Fragment Shader Interlock/Ordering extension missing!");
			statement("#endif");
		}

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	for (auto &cap : ir.declared_capabilities)
		if (cap == CapabilityRayTraversalPrimitiveCullingKHR)
			statement("layout(primitive_culling);");

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}